

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_pool.cpp
# Opt level: O2

EvictionResult * __thiscall
duckdb::BufferPool::EvictBlocks
          (EvictionResult *__return_storage_ptr__,BufferPool *this,MemoryTag tag,idx_t extra_memory,
          idx_t memory_limit,
          unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *buffer)

{
  unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true> *puVar1;
  type pEVar2;
  reference this_00;
  type pEVar3;
  InternalException *this_01;
  unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true> *this_02;
  allocator local_79;
  TempBufferPoolReservation *local_78;
  vector<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>,_true>
  *local_70;
  idx_t local_68;
  idx_t local_60;
  unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *local_58;
  string local_50;
  
  local_70 = &this->queues;
  this_02 = (this->queues).
            super_vector<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->queues).
           super_vector<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_78 = &__return_storage_ptr__->reservation;
  local_68 = extra_memory;
  local_60 = memory_limit;
  local_58 = buffer;
  while( true ) {
    if (this_02 == puVar1) {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_50,
                 "Exited BufferPool::EvictBlocksInternal without obtaining BufferPool::EvictionResult"
                 ,&local_79);
      InternalException::InternalException(this_01,&local_50);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pEVar2 = unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>::
             operator*(this_02);
    (*this->_vptr_BufferPool[4])
              (__return_storage_ptr__,this,pEVar2,(ulong)tag,local_68,local_60,local_58);
    if (__return_storage_ptr__->success != false) break;
    pEVar2 = unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>::
             operator*(this_02);
    this_00 = vector<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>,_true>
              ::back(local_70);
    pEVar3 = unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>::
             operator*(this_00);
    if (pEVar2 == pEVar3) {
      return __return_storage_ptr__;
    }
    TempBufferPoolReservation::~TempBufferPoolReservation(local_78);
    this_02 = this_02 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

BufferPool::EvictionResult BufferPool::EvictBlocks(MemoryTag tag, idx_t extra_memory, idx_t memory_limit,
                                                   unique_ptr<FileBuffer> *buffer) {
	for (auto &queue : queues) {
		auto block_result = EvictBlocksInternal(*queue, tag, extra_memory, memory_limit, buffer);
		if (block_result.success || RefersToSameObject(*queue, *queues.back())) {
			return block_result; // Return upon success or upon last queue
		}
	}
	// This can never happen since we always return when i == 1. Exception to silence compiler warning
	throw InternalException("Exited BufferPool::EvictBlocksInternal without obtaining BufferPool::EvictionResult");
}